

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decNumber.cpp
# Opt level: O0

int32_t decGetInt(decNumber *dn)

{
  uint uVar1;
  bool bVar2;
  int32_t save;
  int32_t rem;
  int32_t count;
  int32_t iStack_2c;
  uint8_t neg;
  int32_t ilength;
  int32_t got;
  uint8_t *up;
  int32_t theInt;
  decNumber *dn_local;
  
  count = dn->digits + dn->exponent;
  bVar2 = (dn->bits & 0x80) != 0;
  if (((dn->lsu[0] == '\0') && (dn->digits == 1)) && ((dn->bits & 0x70) == 0)) {
    dn_local._4_4_ = 0;
  }
  else {
    _ilength = dn->lsu;
    up._4_4_ = 0;
    if (dn->exponent < 0) {
      for (save = -dn->exponent; 0 < save; save = save + -1) {
        if (*_ilength != 0) {
          return -0x80000000;
        }
        _ilength = _ilength + 1;
      }
      if (save == 0) {
        iStack_2c = 0;
      }
      else {
        up._4_4_ = (uint)(*_ilength >> ((byte)save & 0x1f)) * multies[save] >> 0x11;
        if ((uint)*_ilength != up._4_4_ * DECPOWERS[save]) {
          return -0x80000000;
        }
        iStack_2c = 1 - save;
        _ilength = _ilength + 1;
      }
    }
    else {
      iStack_2c = dn->exponent;
    }
    if (iStack_2c == 0) {
      up._4_4_ = (uint)*_ilength;
      iStack_2c = 1;
      _ilength = _ilength + 1;
    }
    uVar1 = up._4_4_;
    up._4_4_ = uVar1;
    if (count < 0xb) {
      for (; iStack_2c < count; iStack_2c = iStack_2c + 1) {
        up._4_4_ = (uint)*_ilength * DECPOWERS[iStack_2c] + up._4_4_;
        _ilength = _ilength + 1;
      }
      if (count == 10) {
        if ((int)up._4_4_ / (int)DECPOWERS[iStack_2c + -1] == (uint)_ilength[-1]) {
          if ((bVar2) && (0x773593fd < (int)up._4_4_)) {
            count = 0xb;
          }
          else if ((!bVar2) && (999999999 < (int)up._4_4_)) {
            count = 0xb;
          }
        }
        else {
          count = 0xb;
        }
        if (count == 0xb) {
          up._4_4_ = uVar1;
        }
      }
    }
    if (count < 0xb) {
      if (bVar2) {
        up._4_4_ = -up._4_4_;
      }
      dn_local._4_4_ = up._4_4_;
    }
    else if ((up._4_4_ & 1) == 0) {
      dn_local._4_4_ = 0x80000002;
    }
    else {
      dn_local._4_4_ = 0x80000003;
    }
  }
  return dn_local._4_4_;
}

Assistant:

static Int decGetInt(const decNumber *dn) {
  Int  theInt;                          /* result accumulator  */
  const Unit *up;                       /* work  */
  Int  got;                             /* digits (real or not) processed  */
  Int  ilength=dn->digits+dn->exponent; /* integral length  */
  Flag neg=decNumberIsNegative(dn);     /* 1 if -ve  */

  /* The number must be an integer that fits in 10 digits  */
  /* Assert, here, that 10 is enough for any rescale Etiny  */
  #if DEC_MAX_EMAX > 999999999
    #error GetInt may need updating [for Emax]
  #endif
  #if DEC_MIN_EMIN < -999999999
    #error GetInt may need updating [for Emin]
  #endif
  if (ISZERO(dn)) return 0;             /* zeros are OK, with any exponent  */

  up=dn->lsu;                           /* ready for lsu  */
  theInt=0;                             /* ready to accumulate  */
  if (dn->exponent>=0) {                /* relatively easy  */
    /* no fractional part [usual]; allow for positive exponent  */
    got=dn->exponent;
    }
   else { /* -ve exponent; some fractional part to check and discard  */
    Int count=-dn->exponent;            /* digits to discard  */
    /* spin up whole units until reach the Unit with the unit digit  */
    for (; count>=DECDPUN; up++) {
      if (*up!=0) return BADINT;        /* non-zero Unit to discard  */
      count-=DECDPUN;
      }
    if (count==0) got=0;                /* [a multiple of DECDPUN]  */
     else {                             /* [not multiple of DECDPUN]  */
      Int rem;                          /* work  */
      /* slice off fraction digits and check for non-zero  */
      #if DECDPUN<=4
        theInt=QUOT10(*up, count);
        rem=*up-theInt*powers[count];
      #else
        rem=*up%powers[count];          /* slice off discards  */
        theInt=*up/powers[count];
      #endif
      if (rem!=0) return BADINT;        /* non-zero fraction  */
      /* it looks good  */
      got=DECDPUN-count;                /* number of digits so far  */
      up++;                             /* ready for next  */
      }
    }
  /* now it's known there's no fractional part  */

  /* tricky code now, to accumulate up to 9.3 digits  */
  if (got==0) {theInt=*up; got+=DECDPUN; up++;} /* ensure lsu is there  */

  if (ilength<11) {
    Int save=theInt;
    /* collect any remaining unit(s)  */
    for (; got<ilength; up++) {
      theInt+=*up*powers[got];
      got+=DECDPUN;
      }
    if (ilength==10) {                  /* need to check for wrap  */
      if (theInt/(Int)powers[got-DECDPUN]!=(Int)*(up-1)) ilength=11;
         /* [that test also disallows the BADINT result case]  */
       else if (neg && theInt>1999999997) ilength=11;
       else if (!neg && theInt>999999999) ilength=11;
      if (ilength==11) theInt=save;     /* restore correct low bit  */
      }
    }

  if (ilength>10) {                     /* too big  */
    if (theInt&1) return BIGODD;        /* bottom bit 1  */
    return BIGEVEN;                     /* bottom bit 0  */
    }

  if (neg) theInt=-theInt;              /* apply sign  */
  return theInt;
  }